

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UndoMove.cpp
# Opt level: O0

void __thiscall UndoMove::PutMove(UndoMove *this,Move move,size_t row,size_t col)

{
  size_type sVar1;
  value_type_conflict1 local_48;
  value_type_conflict1 local_40;
  value_type_conflict1 local_38;
  value_type_conflict1 local_30;
  size_t local_28;
  size_t col_local;
  size_t row_local;
  UndoMove *pUStack_10;
  Move move_local;
  UndoMove *this_local;
  
  local_28 = col;
  col_local = row;
  row_local._4_4_ = move;
  pUStack_10 = this;
  sVar1 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->moveStack);
  if (sVar1 == 10) {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->moveStack);
  }
  switch(row_local._4_4_) {
  case UP:
    local_30 = (col_local - 1) * 10 + local_28;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->moveStack,&local_30)
    ;
    break;
  case RIGHT:
    local_38 = col_local * 10 + local_28 + 1;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->moveStack,&local_38)
    ;
    break;
  case DOWN:
    local_40 = (col_local + 1) * 10 + local_28;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->moveStack,&local_40)
    ;
    break;
  case LEFT:
    local_48 = (col_local * 10 + local_28) - 1;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->moveStack,&local_48)
    ;
  }
  return;
}

Assistant:

void UndoMove::PutMove( Move move, size_t row, size_t col )
{
    if ( moveStack.size() == MOVE_STACK_LIMIT )
    {
        moveStack.pop_front();
    }

    switch ( move )
    {
        case Move::UP:
            moveStack.push_back(( row - 1 ) * 10 + col );
            break;
        case Move::RIGHT:
            moveStack.push_back( row * 10 + col + 1 );
            break;
        case Move::DOWN:
            moveStack.push_back(( row + 1 ) * 10 + col );
            break;
        case Move::LEFT:
            moveStack.push_back( row * 10 + col -1  );
            break;
    }
}